

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

wchar_t format_function_key(char *buf,Terminal *term,wchar_t key_number,_Bool shift,_Bool ctrl,
                           _Bool alt,_Bool *consumed_alt)

{
  int iVar1;
  wchar_t wVar2;
  uint uVar3;
  wchar_t wVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  
  if (key_number < L'\x01') {
    __assert_fail("key_number > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x1cfb,
                  "int format_function_key(char *, Terminal *, int, _Bool, _Bool, _Bool, _Bool *)");
  }
  if (0x14 < (uint)key_number) {
    __assert_fail("key_number < lenof(key_number_to_tilde_code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x1cfc,
                  "int format_function_key(char *, Terminal *, int, _Bool, _Bool, _Bool, _Bool *)");
  }
  wVar4 = term->funky_type;
  wVar2 = key_number;
  if (1 < (uint)(wVar4 + L'\xfffffffb')) {
    wVar2 = key_number + L'\n';
    if (key_number >= L'\v' || !shift) {
      wVar2 = key_number;
    }
    shift = (key_number < L'\v' && shift) != shift;
  }
  if (wVar4 == L'\x05') {
    uVar3 = key_number + L'\xffffffff';
    if (L'\f' < key_number) {
      uVar3 = 0;
    }
    uVar8 = uVar3 + 0xc;
    if (shift == false) {
      uVar8 = uVar3;
    }
    uVar3 = uVar8 + 0x18;
    if (!ctrl) {
      uVar3 = uVar8;
    }
    uVar5 = (ulong)(uint)(int)"MNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz@[\\]^_`{"[uVar3];
    pcVar6 = "\x1b[%c";
    goto LAB_0010f809;
  }
  uVar5 = (ulong)(uint)wVar2;
  uVar3 = format_function_key::key_number_to_tilde_code[uVar5];
  if (term->vt52_mode == false) {
    if ((wVar4 != L'\x04') || (0xc < (uint)wVar2)) goto LAB_0010f7f2;
    pcVar6 = "\x1bO%c";
  }
  else {
    if (0xc < (uint)wVar2) {
LAB_0010f7f2:
      if ((wVar4 == L'\x01') && ((uint)wVar2 < 6)) {
        uVar3 = uVar3 + 0x36;
        pcVar6 = "\x1b[[%c";
      }
      else {
        uVar8 = 0;
        if ((wVar4 | 4U) == 6) {
          if ((uint)wVar2 < 5) {
            if (term->vt52_mode == false) {
              uVar5 = 0;
              if (wVar4 == L'\x06') {
                if (alt && consumed_alt != (_Bool *)0x0) {
                  *consumed_alt = true;
                }
                iVar1 = (uint)ctrl * 4 + (uint)alt * 2;
                uVar5 = (ulong)(shift + 1 + iVar1);
                if (iVar1 + (uint)shift == 0) {
                  uVar5 = 0;
                }
              }
              uVar3 = uVar3 + 0x45;
              if ((int)uVar5 != 0) {
                pcVar6 = "\x1b[1;%d%c";
                uVar8 = uVar3;
                goto LAB_0010f885;
              }
              pcVar6 = "\x1bO%c";
            }
            else {
              uVar3 = uVar3 + 0x45;
              pcVar6 = "\x1b%c";
            }
            goto LAB_0010f807;
          }
          if (wVar4 == L'\x06') {
            if (alt && consumed_alt != (_Bool *)0x0) {
              *consumed_alt = true;
            }
            iVar1 = (uint)ctrl * 4 + (uint)alt * 2;
            uVar8 = shift + 1 + iVar1;
            if (iVar1 + (uint)shift == 0) {
              uVar8 = 0;
            }
          }
        }
        if (uVar8 != 0) {
          pcVar6 = "\x1b[%d;%d~";
          uVar5 = (ulong)uVar3;
LAB_0010f885:
          wVar4 = sprintf(buf,pcVar6,uVar5,(ulong)uVar8);
          return wVar4;
        }
        pcVar6 = "\x1b[%d~";
      }
LAB_0010f807:
      uVar5 = (ulong)uVar3;
      goto LAB_0010f809;
    }
    pcVar6 = "\x1b%c";
  }
  uVar7 = (uint)(uVar5 - 6 < 0xf);
  uVar8 = ~uVar7;
  if (9 < uVar5 - 0xb) {
    uVar8 = -uVar7;
  }
  uVar5 = (ulong)(uVar3 + uVar8 + 0x45);
LAB_0010f809:
  wVar4 = sprintf(buf,pcVar6,uVar5);
  return wVar4;
}

Assistant:

int format_function_key(char *buf, Terminal *term, int key_number,
                        bool shift, bool ctrl, bool alt, bool *consumed_alt)
{
    char *p = buf;

    static const int key_number_to_tilde_code[] = {
        -1,                 /* no such key as F0 */
        11, 12, 13, 14, 15, /*gap*/ 17, 18, 19, 20, 21, /*gap*/
        23, 24, 25, 26, /*gap*/ 28, 29, /*gap*/ 31, 32, 33, 34,
    };

    assert(key_number > 0);
    assert(key_number < lenof(key_number_to_tilde_code));

    int index = key_number;
    if (term->funky_type != FUNKY_XTERM_216 && term->funky_type != FUNKY_SCO) {
        if (shift && index <= 10) {
            shift = false;
            index += 10;
        }
    }

    int code = key_number_to_tilde_code[index];

    if (term->funky_type == FUNKY_SCO) {
        /* SCO function keys */
        static const char sco_codes[] =
            "MNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz@[\\]^_`{";
        index = (key_number >= 1 && key_number <= 12) ? key_number - 1 : 0;
        if (shift) index += 12;
        if (ctrl) index += 24;
        p += sprintf(p, "\x1B[%c", sco_codes[index]);
    } else if ((term->vt52_mode || term->funky_type == FUNKY_VT100P) &&
               code >= 11 && code <= 24) {
        int offt = 0;
        if (code > 15)
            offt++;
        if (code > 21)
            offt++;
        if (term->vt52_mode)
            p += sprintf(p, "\x1B%c", code + 'P' - 11 - offt);
        else
            p += sprintf(p, "\x1BO%c", code + 'P' - 11 - offt);
    } else if (term->funky_type == FUNKY_LINUX && code >= 11 && code <= 15) {
        p += sprintf(p, "\x1B[[%c", code + 'A' - 11);
    } else if ((term->funky_type == FUNKY_XTERM ||
                term->funky_type == FUNKY_XTERM_216) &&
               code >= 11 && code <= 14) {
        if (term->vt52_mode)
            p += sprintf(p, "\x1B%c", code + 'P' - 11);
        else {
            int bitmap = 0;
            if (term->funky_type == FUNKY_XTERM_216)
                bitmap = shift_bitmap(shift, ctrl, alt, consumed_alt);
            if (bitmap)
                p += sprintf(p, "\x1B[1;%d%c", bitmap, code + 'P' - 11);
            else
                p += sprintf(p, "\x1BO%c", code + 'P' - 11);
        }
    } else {
        int bitmap = 0;
        if (term->funky_type == FUNKY_XTERM_216)
            bitmap = shift_bitmap(shift, ctrl, alt, consumed_alt);
        if (bitmap)
            p += sprintf(p, "\x1B[%d;%d~", code, bitmap);
        else
            p += sprintf(p, "\x1B[%d~", code);
    }

    return p - buf;
}